

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skew.cpp
# Opt level: O2

void duckdb::SkewnessOperation::Finalize<double,duckdb::SkewState>
               (SkewState *state,double *target,AggregateFinalizeData *finalize_data)

{
  ulong uVar1;
  bool bVar2;
  OutOfRangeException *this;
  double dVar3;
  undefined1 auVar4 [16];
  allocator local_61;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double local_40;
  string local_38;
  
  uVar1 = state->n;
  if (uVar1 < 3) {
    AggregateFinalizeData::ReturnNull(finalize_data);
    return;
  }
  auVar4._8_4_ = (int)(uVar1 >> 0x20);
  auVar4._0_8_ = uVar1;
  auVar4._12_4_ = 0x45300000;
  dStack_50 = auVar4._8_8_ - 1.9342813113834067e+25;
  local_58 = dStack_50 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  local_60 = 1.0 / local_58;
  dVar3 = pow((state->sum_sqr - state->sum * state->sum * local_60) * local_60,3.0);
  local_40 = 0.0;
  if (0.0 <= dVar3) {
    local_40 = dVar3;
  }
  local_40 = SQRT(local_40);
  if ((local_40 != 0.0) || (NAN(local_40))) {
    dVar3 = (local_58 + -1.0) * local_58;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    local_58 = (dVar3 / (local_58 + -2.0)) * local_60;
    local_48 = state->sum_sqr * -3.0 * state->sum * local_60 + state->sum_cub;
    dVar3 = pow(state->sum,3.0);
    dVar3 = (((dVar3 + dVar3) * local_60 * local_60 + local_48) * local_58) / local_40;
    *target = dVar3;
    bVar2 = Value::DoubleIsFinite(dVar3);
    if (!bVar2) {
      this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_38,"SKEW is out of range!",&local_61);
      OutOfRangeException::OutOfRangeException(this,&local_38);
      __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    *target = NAN;
  }
  return;
}

Assistant:

static void Finalize(STATE &state, TARGET_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.n <= 2) {
			finalize_data.ReturnNull();
			return;
		}
		double n = state.n;
		double temp = 1 / n;
		auto p = std::pow(temp * (state.sum_sqr - state.sum * state.sum * temp), 3);
		if (p < 0) {
			p = 0; // Shouldn't be below 0 but floating points are weird
		}
		double div = std::sqrt(p);
		if (div == 0) {
			target = NAN;
			return;
		}
		double temp1 = std::sqrt(n * (n - 1)) / (n - 2);
		target = temp1 * temp *
		         (state.sum_cub - 3 * state.sum_sqr * state.sum * temp + 2 * pow(state.sum, 3) * temp * temp) / div;
		if (!Value::DoubleIsFinite(target)) {
			throw OutOfRangeException("SKEW is out of range!");
		}
	}